

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool ON_IntersectViewFrustumPlane
               (ON_Viewport *vp,ON_PlaneEquation *plane_equation,ON_SimpleArray<ON_3dPoint> *points)

{
  int iVar1;
  ON_SimpleArray<ON_3dPoint> *this;
  bool bVar2;
  ON_3dPoint *pOVar3;
  ulong uVar4;
  uint uVar5;
  double *t;
  ON_2dVector *pOVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  ON_2dVector OVar18;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dPoint C;
  ON_3dVector Z;
  ON_3dPoint P;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_PgonPt ppt;
  ON_3dPoint F [8];
  double v [8];
  ON_Plane plane;
  ON_3dPoint local_7f0;
  ON_SimpleArray<ON_3dPoint> *local_7d8;
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  ON_3dPoint local_7b0;
  ON_3dPoint local_798;
  ON_3dVector local_780;
  ON_3dVector local_768;
  ON_3dVector local_750;
  ON_3dVector local_738;
  ON_3dVector local_718;
  ON_3dPoint local_6f8;
  ON_3dVector local_6e0;
  ON_3dPoint local_6c8;
  ON_3dPoint local_6a8;
  ON_3dPoint local_688;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  undefined8 uStack_640;
  ON_3dPoint local_638;
  double local_620;
  double dStack_618;
  double local_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double local_5f0;
  double dStack_5e8;
  double local_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  double local_5c0;
  double dStack_5b8;
  double local_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double local_590;
  double dStack_588;
  double local_580;
  double adStack_578 [8];
  ON_Plane local_538;
  ON_3dPoint local_4b8;
  ON_2dVector OStack_4a0;
  undefined8 uStack_490;
  undefined1 local_488 [24];
  ON_2dVector local_470;
  ulong auStack_460 [4];
  ON_2dVector local_440 [65];
  
  local_6f8.z = (vp->m_CamLoc).z;
  local_6f8.x = (vp->m_CamLoc).x;
  local_6f8.y = (vp->m_CamLoc).y;
  local_718.z = (vp->m_CamX).z;
  local_718.x = (vp->m_CamX).x;
  local_718.y = (vp->m_CamX).y;
  local_738.z = (vp->m_CamY).z;
  local_738.x = (vp->m_CamY).x;
  local_738.y = (vp->m_CamY).y;
  local_538.origin.z = (vp->m_CamZ).z;
  local_538.origin.x = (vp->m_CamZ).x;
  local_538.origin.y = (vp->m_CamZ).y;
  ON_3dVector::operator-(&local_6e0,(ON_3dVector *)&local_538);
  if ((vp->m_bValidCamera != true) || (vp->m_bValidFrustum != true)) {
    return false;
  }
  dVar16 = vp->m_frus_left;
  local_7d8 = (ON_SimpleArray<ON_3dPoint> *)vp->m_frus_right;
  dVar17 = vp->m_frus_bottom;
  local_7b8 = vp->m_frus_top;
  local_7c0 = vp->m_frus_near;
  local_7c8 = vp->m_frus_far;
  ON_Plane::ON_Plane(&local_538,plane_equation);
  bVar2 = ON_Plane::IsValid(&local_538);
  if (bVar2) {
    if (vp->m_projection == perspective_view) {
      local_7d0 = local_7c8 / local_7c0;
    }
    else {
      local_7d0 = 1.0;
    }
    operator*(&local_750,dVar16,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    operator*(&local_768,dVar17,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c0,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    local_638.z = local_7f0.z;
    local_638.x = local_7f0.x;
    local_638.y = local_7f0.y;
    operator*(&local_750,(double)local_7d8,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    operator*(&local_768,dVar17,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c0,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    local_610 = local_7f0.z;
    local_620 = local_7f0.x;
    dStack_618 = local_7f0.y;
    operator*(&local_750,(double)local_7d8,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    operator*(&local_768,local_7b8,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c0,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    local_5f8 = local_7f0.z;
    local_608 = local_7f0.x;
    dStack_600 = local_7f0.y;
    operator*(&local_750,dVar16,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    operator*(&local_768,local_7b8,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c0,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    local_5e0 = local_7f0.z;
    local_5f0 = local_7f0.x;
    dStack_5e8 = local_7f0.y;
    dVar16 = dVar16 * local_7d0;
    operator*(&local_750,dVar16,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    dVar17 = dVar17 * local_7d0;
    operator*(&local_768,dVar17,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c8,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    local_5c8 = local_7f0.z;
    local_5d8 = local_7f0.x;
    dStack_5d0 = local_7f0.y;
    local_7d8 = (ON_SimpleArray<ON_3dPoint> *)((double)local_7d8 * local_7d0);
    operator*(&local_750,(double)local_7d8,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    operator*(&local_768,dVar17,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c8,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    local_5b0 = local_7f0.z;
    local_5c0 = local_7f0.x;
    dStack_5b8 = local_7f0.y;
    operator*(&local_750,(double)local_7d8,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    local_7b8 = local_7b8 * local_7d0;
    operator*(&local_768,local_7b8,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c8,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    local_598 = local_7f0.z;
    local_5a8 = local_7f0.x;
    dStack_5a0 = local_7f0.y;
    operator*(&local_750,dVar16,&local_718);
    ON_3dPoint::operator+(&local_7b0,&local_6f8,&local_750);
    operator*(&local_768,local_7b8,&local_738);
    ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
    operator*(&local_780,local_7c8,&local_6e0);
    ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
    pOVar3 = &local_638;
    local_580 = local_7f0.z;
    local_590 = local_7f0.x;
    dStack_588 = local_7f0.y;
    lVar11 = 0;
    local_7d8 = points;
    do {
      dVar16 = ON_PlaneEquation::ValueAt(plane_equation,*pOVar3);
      adStack_578[lVar11] = dVar16;
      lVar11 = lVar11 + 1;
      pOVar3 = pOVar3 + 1;
    } while (lVar11 != 8);
    lVar11 = 0;
    uVar7 = 0;
    do {
      iVar8 = (&DAT_006e9c90)[lVar11 * 2];
      dVar16 = adStack_578[iVar8];
      iVar1 = (&DAT_006e9c94)[lVar11 * 2];
      dVar17 = adStack_578[iVar1];
      local_688.x = (&local_638)[iVar8].x;
      local_688.y = (&local_638)[iVar8].y;
      local_688.z = (&local_638)[iVar8].z;
      local_6a8.x = (&local_638)[iVar1].x;
      local_6a8.y = (&local_638)[iVar1].y;
      local_6a8.z = (&local_638)[iVar1].z;
      if (((dVar16 <= 0.0) && (0.0 <= dVar17)) || ((0.0 <= dVar16 && (dVar17 <= 0.0)))) {
        if ((dVar16 != dVar17) || (NAN(dVar16) || NAN(dVar17))) {
          dVar17 = dVar17 / (dVar17 - dVar16);
          operator*(&local_798,dVar17,&local_688);
          operator*(&local_7b0,1.0 - dVar17,&local_6a8);
          ON_3dPoint::operator+(&local_7f0,&local_798,&local_7b0);
          local_6c8.z = local_7f0.z;
          local_6c8.x = local_7f0.x;
          local_6c8.y = local_7f0.y;
          iVar8 = 1;
          pOVar3 = &local_6c8;
          uVar5 = uVar7;
        }
        else {
          lVar9 = (long)(int)uVar7;
          (&local_4b8)[lVar9 * 2].z = (&local_638)[iVar8].z;
          dVar16 = (&local_638)[iVar8].y;
          (&local_4b8)[lVar9 * 2].x = (&local_638)[iVar8].x;
          (&local_4b8)[lVar9 * 2].y = dVar16;
          iVar8 = 2;
          pOVar3 = &local_638 + iVar1;
          uVar5 = uVar7 + 1;
        }
        uVar7 = uVar7 + iVar8;
        lVar9 = (long)(int)uVar5;
        (&local_4b8)[lVar9 * 2].z = pOVar3->z;
        dVar16 = pOVar3->y;
        (&local_4b8)[lVar9 * 2].x = pOVar3->x;
        (&local_4b8)[lVar9 * 2].y = dVar16;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xc);
    if (0 < (int)uVar7) {
      uVar10 = 0;
      t = &OStack_4a0.y;
      iVar8 = 0;
      do {
        pOVar6 = (ON_2dVector *)(t + -1);
        ON_Plane::ClosestPointTo(&local_538,*(ON_3dPoint *)(t + -4),(double *)pOVar6,t);
        this = local_7d8;
        dVar16 = *t;
        dVar17 = (&OStack_4a0)[(long)iVar8 * 3].y;
        if (dVar16 < dVar17) {
LAB_00670075:
          iVar8 = (int)uVar10;
        }
        else if (((dVar16 == dVar17) && (!NAN(dVar16) && !NAN(dVar17))) &&
                (pOVar6->x <= (&OStack_4a0)[(long)iVar8 * 3].x &&
                 (&OStack_4a0)[(long)iVar8 * 3].x != pOVar6->x)) goto LAB_00670075;
        uVar10 = uVar10 + 1;
        t = t + 6;
      } while (uVar7 != uVar10);
      lVar11 = (long)iVar8;
      local_668 = (&local_4b8)[lVar11 * 2].x;
      dStack_660 = (&local_4b8)[lVar11 * 2].y;
      local_658 = (&local_4b8)[lVar11 * 2].z;
      dStack_650 = (&OStack_4a0)[lVar11 * 3].x;
      local_648 = (&OStack_4a0)[lVar11 * 3].y;
      uStack_640 = *(undefined8 *)(local_488 + lVar11 * 0x30 + -8);
      if (iVar8 != 0) {
        (&OStack_4a0)[lVar11 * 3].y = OStack_4a0.y;
        *(undefined8 *)(local_488 + lVar11 * 0x30 + -8) = uStack_490;
        (&local_4b8)[lVar11 * 2].z = local_4b8.z;
        (&OStack_4a0)[lVar11 * 3].x = OStack_4a0.x;
        (&local_4b8)[lVar11 * 2].x = local_4b8.x;
        (&local_4b8)[lVar11 * 2].y = local_4b8.y;
        local_4b8.x = local_668;
        local_4b8.y = dStack_660;
        local_4b8.z = local_658;
        OStack_4a0.x = dStack_650;
        OStack_4a0.y = local_648;
      }
      uStack_490 = 0xffefffffffffffff;
      if (uVar7 != 1) {
        uVar10 = 2;
        if (2 < (int)uVar7) {
          uVar10 = (ulong)uVar7;
        }
        lVar11 = 0;
        do {
          dVar16 = *(double *)((long)&local_470.x + lVar11) - OStack_4a0.x;
          dVar17 = *(double *)((long)auStack_460 + lVar11 + -8) - OStack_4a0.y;
          *(double *)((long)&local_470.x + lVar11) = dVar16;
          *(double *)((long)auStack_460 + lVar11 + -8) = dVar17;
          *(ulong *)((long)auStack_460 + lVar11) =
               ~-(ulong)(0.0 < dVar17) & 0xffefffffffffffff |
               (ulong)(-dVar16 / dVar17) & -(ulong)(0.0 < dVar17);
          lVar11 = lVar11 + 0x30;
        } while (uVar10 * 0x30 + -0x30 != lVar11);
      }
      OStack_4a0.x = 0.0;
      OStack_4a0.y = 0.0;
      ON_qsort(local_488,(ulong)(uVar7 - 1),0x30,comparePptAngle);
      ON_SimpleArray<ON_3dPoint>::Append(this,&local_4b8);
      OVar18 = ON_2dVector::operator-(&local_470,&OStack_4a0);
      uVar14 = OVar18.y._0_4_;
      uVar15 = OVar18.y._4_4_;
      uVar12 = OVar18.x._0_4_;
      uVar13 = OVar18.x._4_4_;
      uVar10 = 1;
      if (2 < (int)uVar7) {
        pOVar6 = local_440;
        iVar8 = 0;
        do {
          uVar4 = (ulong)iVar8;
          if ((pOVar6->x - (&OStack_4a0)[uVar4 * 3].x) * (double)CONCAT44(uVar15,uVar14) <
              (pOVar6->y - (&OStack_4a0)[uVar4 * 3].y) * (double)CONCAT44(uVar13,uVar12)) {
            ON_SimpleArray<ON_3dPoint>::Append(this,(ON_3dPoint *)&pOVar6[-5].y);
            iVar8 = (int)uVar10;
            uVar4 = uVar10;
          }
          OVar18 = ON_2dVector::operator-(pOVar6,&OStack_4a0 + uVar4 * 3);
          uVar14 = OVar18.y._0_4_;
          uVar15 = OVar18.y._4_4_;
          uVar12 = OVar18.x._0_4_;
          uVar13 = OVar18.x._4_4_;
          pOVar6 = pOVar6 + 3;
          lVar11 = uVar10 - uVar7;
          uVar10 = uVar10 + 1;
        } while (lVar11 != -2);
        if ((int)uVar10 <= iVar8) goto LAB_006702d3;
      }
      ON_SimpleArray<ON_3dPoint>::Append(this,&local_4b8 + (uVar10 & 0xffffffff) * 2);
    }
  }
LAB_006702d3:
  ON_Plane::~ON_Plane(&local_538);
  return bVar2;
}

Assistant:

bool ON_IntersectViewFrustumPlane( 
    const ON_Viewport& vp,
    const ON_PlaneEquation& plane_equation, 
    ON_SimpleArray<ON_3dPoint>& points 
    )
{

  double left, right, bottom, top, near_dist, far_dist;
  double v[8], v0, v1, s;
  ON_PgonPt ppt, ppt_list[24];
  ON_3dPoint F[8], P0, P1, P;
  ON_2dVector D;
  const ON_3dPoint  C = vp.CameraLocation();
  const ON_3dVector X = vp.CameraX();
  const ON_3dVector Y = vp.CameraY();
  const ON_3dVector Z = -vp.CameraZ();
  int e[12][2] = {{0,1},{1,2},{2,3},{3,0},
                  {4,5},{5,6},{6,7},{7,4},
                  {0,4},{1,5},{2,6},{3,7}};
  int i, i0, i1;
  int ppt_count = 0;

  if ( !vp.IsValidCamera() || !vp.GetFrustum(&left,&right,&bottom,&top,&near_dist,&far_dist) )
    return false;

  const ON_Plane plane(plane_equation);
  if ( !plane.IsValid() )
    return false;

  s = ON::perspective_view == vp.Projection() 
    ? far_dist/near_dist
    : 1.0;
  F[0] = C + left*X  + bottom*Y + near_dist*Z;
  F[1] = C + right*X + bottom*Y + near_dist*Z;
  F[2] = C + right*X + top*Y    + near_dist*Z;
  F[3] = C + left*X  + top*Y    + near_dist*Z;

  F[4] = C + s*left*X  + s*bottom*Y + far_dist*Z;
  F[5] = C + s*right*X + s*bottom*Y + far_dist*Z;
  F[6] = C + s*right*X + s*top*Y    + far_dist*Z;
  F[7] = C + s*left*X  + s*top*Y    + far_dist*Z;

  for ( i = 0; i < 8; i++ )
  {
    v[i] = plane_equation.ValueAt(F[i]);
  }

  for ( i = 0; i < 12; i++ )
  {
    v0 = v[e[i][0]];
    v1 = v[e[i][1]];
    P0 = F[e[i][0]];
    P1 = F[e[i][1]];
    if ( (v0 <= 0.0 && v1 >= 0.0) || (v0 >= 0.0 && v1 <= 0.0) )
    {
      if ( v0 == v1 )
      {
        ppt_list[ppt_count++].m_P = P0;
        ppt_list[ppt_count++].m_P = P1;
      }
      else
      {
        s = v1/(v1-v0);
        P = s*P0 + (1.0-s)*P1;
        ppt_list[ppt_count++].m_P = P;
      }
    }
  }

  if ( ppt_count <= 0 )
    return true; // plane misses frustum

  i0 = 0;
  for ( i = 0; i < ppt_count; i++ )
  {
    plane.ClosestPointTo( ppt_list[i].m_P, &ppt_list[i].m_Q.x, &ppt_list[i].m_Q.y );
    if (     ppt_list[i].m_Q.y < ppt_list[i0].m_Q.y 
         || (ppt_list[i].m_Q.y == ppt_list[i0].m_Q.y && ppt_list[i].m_Q.x < ppt_list[i0].m_Q.x) )
      i0 = i;
  }

  // Use Gram scan to get the convex hull and save it in points[].
  // See http://en.wikipedia.org/wiki/Graham_scan for details.

  // put point with smallest m_Q.y coordinate in ppt_list[0].
  ppt = ppt_list[i0];
  if ( i0 )
  {
    ppt_list[i0] = ppt_list[0];
    ppt_list[0] = ppt;
    i0 = 0;
  }

  // sort points by the angle (ppt_list[i].m_Q = ppt_list[0].m_Q) makes
  // with the positive x axis.  This is the same as sorting them by
  // -cot(angle) = -deltax/deltay.
  ppt_list[0].m_negcotangle = -ON_DBL_MAX; // -cot(0) = - infinity
  for ( i = 1; i < ppt_count; i++ )
  {
    ppt_list[i].m_Q.x -= ppt_list[0].m_Q.x;
    ppt_list[i].m_Q.y -= ppt_list[0].m_Q.y;
    ppt_list[i].m_negcotangle = (0.0 >= ppt_list[i].m_Q.y) ? -ON_DBL_MAX : -ppt_list[i].m_Q.x/ppt_list[i].m_Q.y;
  }
  ppt_list[0].m_Q.x = 0.0;
  ppt_list[0].m_Q.y = 0.0;
  ON_qsort(ppt_list+1,ppt_count-1,sizeof(ppt_list[0]),comparePptAngle);

  points.Append(ppt_list[0].m_P);
  i0 = 0;
  i1 = 1;
  D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;

  for ( i = 2; i < ppt_count; i++ )
  {
    if ( (ppt_list[i].m_Q.y - ppt_list[i0].m_Q.y)*D.x <= (ppt_list[i].m_Q.x - ppt_list[i0].m_Q.x)*D.y )
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "right" turn or collinear.
      // Drop ppt_list[i1].
      i1 = i;
    }
    else
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "left" turn.
      points.Append(ppt_list[i1].m_P);
      i0 = i1;
      i1 = i;
    }
    D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;
  }

  if ( i1 > i0 )
    points.Append(ppt_list[i1].m_P);

  return true;
}